

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CacheInstArray(Fts5Cursor *pCsr)

{
  Fts5PoslistReader *pFVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  u8 *puVar6;
  int *piVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int n;
  u8 *a;
  Fts5PoslistReader *local_78;
  int local_50;
  int local_4c;
  long local_48;
  u8 *local_40;
  u8 *local_38;
  
  local_4c = 0;
  uVar10 = 0;
  if (pCsr->pExpr != (Fts5Expr *)0x0) {
    uVar10 = pCsr->pExpr->nPhrase;
  }
  iVar2 = *(int *)&((pCsr->base).pVtab[1].pModule)->xBestIndex;
  local_78 = pCsr->aInstIter;
  if (local_78 == (Fts5PoslistReader *)0x0) {
    local_78 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&local_4c,(long)(int)uVar10 << 5);
    pCsr->aInstIter = local_78;
    if (local_78 == (Fts5PoslistReader *)0x0) {
      return local_4c;
    }
  }
  if (local_4c == 0 && 0 < (int)uVar10) {
    piVar7 = &local_78->i;
    uVar12 = 0;
    while (iVar4 = fts5CsrPoslist(pCsr,(int)uVar12,&local_38,&local_50), iVar4 == 0) {
      *(undefined8 *)(piVar7 + -1) = 0;
      *(undefined8 *)(piVar7 + 1) = 0;
      *(i64 *)(piVar7 + 3) = 0;
      ((Fts5PoslistReader *)(piVar7 + -3))->a = local_38;
      piVar7[-1] = local_50;
      iVar4 = sqlite3Fts5PoslistNext64(local_38,local_50,piVar7,(i64 *)(piVar7 + 3));
      if (iVar4 != 0) {
        *(u8 *)((long)piVar7 + 5) = '\x01';
      }
      uVar12 = uVar12 + 1;
      iVar13 = 0;
      if (uVar10 <= uVar12) goto LAB_001d0eb6;
      piVar7 = piVar7 + 8;
    }
  }
  else {
    iVar4 = local_4c;
    iVar13 = local_4c;
    if (local_4c == 0) {
LAB_001d0eb6:
      if (0 < (int)uVar10) {
        local_40 = &local_78->bEof;
        lVar11 = 0;
        do {
          uVar8 = 0xffffffff;
          uVar12 = 0;
          puVar6 = local_40;
          do {
            if ((*puVar6 == '\0') &&
               (((int)uVar8 < 0 || (*(long *)(puVar6 + 7) < local_78[uVar8].iPos)))) {
              uVar8 = (uint)uVar12;
            }
            uVar12 = uVar12 + 1;
            puVar6 = puVar6 + 0x20;
          } while (uVar10 != uVar12);
          lVar14 = lVar11;
          iVar4 = iVar13;
          if ((int)uVar8 < 0) goto LAB_001d1024;
          lVar14 = lVar11 + 1;
          iVar4 = pCsr->nInstAlloc;
          piVar7 = pCsr->aInst;
          if (iVar4 <= (int)lVar14) {
            iVar9 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar9 = 0x20;
            }
            pCsr->nInstAlloc = iVar9;
            local_48 = lVar11;
            iVar5 = sqlite3_initialize();
            iVar4 = 7;
            if ((iVar5 != 0) ||
               (piVar7 = (int *)sqlite3Realloc(piVar7,(long)iVar9 * 0xc), piVar7 == (int *)0x0))
            goto LAB_001d1024;
            pCsr->aInst = piVar7;
            lVar11 = local_48;
          }
          piVar7[lVar11 * 3] = uVar8;
          lVar3 = local_78[uVar8].iPos;
          iVar9 = (int)((ulong)lVar3 >> 0x20);
          piVar7[lVar11 * 3 + 1] = iVar9;
          piVar7[lVar11 * 3 + 2] = (uint)lVar3 & 0x7fffffff;
          iVar4 = 0x10b;
          if ((lVar3 < 0) || (iVar2 <= iVar9)) goto LAB_001d1024;
          pFVar1 = local_78 + uVar8;
          iVar4 = sqlite3Fts5PoslistNext64(pFVar1->a,pFVar1->n,&pFVar1->i,&local_78[uVar8].iPos);
          if (iVar4 != 0) {
            pFVar1->bEof = '\x01';
          }
          lVar11 = lVar14;
          iVar4 = iVar13;
          if ((int)uVar10 < 1) goto LAB_001d1024;
        } while( true );
      }
      lVar14 = 0;
      iVar4 = iVar13;
      goto LAB_001d1024;
    }
  }
  lVar14 = 0;
LAB_001d1024:
  pCsr->nInstCount = (int)lVar14;
  *(byte *)&pCsr->csrflags = (byte)pCsr->csrflags & 0xf7;
  return iVar4;
}

Assistant:

static int fts5CacheInstArray(Fts5Cursor *pCsr){
  int rc = SQLITE_OK;
  Fts5PoslistReader *aIter;       /* One iterator for each phrase */
  int nIter;                      /* Number of iterators/phrases */
  int nCol = ((Fts5Table*)pCsr->base.pVtab)->pConfig->nCol;
  
  nIter = sqlite3Fts5ExprPhraseCount(pCsr->pExpr);
  if( pCsr->aInstIter==0 ){
    sqlite3_int64 nByte = sizeof(Fts5PoslistReader) * nIter;
    pCsr->aInstIter = (Fts5PoslistReader*)sqlite3Fts5MallocZero(&rc, nByte);
  }
  aIter = pCsr->aInstIter;

  if( aIter ){
    int nInst = 0;                /* Number instances seen so far */
    int i;

    /* Initialize all iterators */
    for(i=0; i<nIter && rc==SQLITE_OK; i++){
      const u8 *a;
      int n; 
      rc = fts5CsrPoslist(pCsr, i, &a, &n);
      if( rc==SQLITE_OK ){
        sqlite3Fts5PoslistReaderInit(a, n, &aIter[i]);
      }
    }

    if( rc==SQLITE_OK ){
      while( 1 ){
        int *aInst;
        int iBest = -1;
        for(i=0; i<nIter; i++){
          if( (aIter[i].bEof==0) 
              && (iBest<0 || aIter[i].iPos<aIter[iBest].iPos) 
            ){
            iBest = i;
          }
        }
        if( iBest<0 ) break;

        nInst++;
        if( nInst>=pCsr->nInstAlloc ){
          pCsr->nInstAlloc = pCsr->nInstAlloc ? pCsr->nInstAlloc*2 : 32;
          aInst = (int*)sqlite3_realloc64(
              pCsr->aInst, pCsr->nInstAlloc*sizeof(int)*3
              );
          if( aInst ){
            pCsr->aInst = aInst;
          }else{
            rc = SQLITE_NOMEM;
            break;
          }
        }

        aInst = &pCsr->aInst[3 * (nInst-1)];
        aInst[0] = iBest;
        aInst[1] = FTS5_POS2COLUMN(aIter[iBest].iPos);
        aInst[2] = FTS5_POS2OFFSET(aIter[iBest].iPos);
        if( aInst[1]<0 || aInst[1]>=nCol ){
          rc = FTS5_CORRUPT;
          break;
        }
        sqlite3Fts5PoslistReaderNext(&aIter[iBest]);
      }
    }

    pCsr->nInstCount = nInst;
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_INST);
  }
  return rc;
}